

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::DragIntN(char *label,int *v,int components,float v_speed,int v_min,int v_max,
                    char *display_format)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow *pIVar3;
  char *text_end;
  int local_50;
  int i;
  bool value_changed;
  ImGuiContext *g;
  ImGuiWindow *window;
  char *display_format_local;
  int v_max_local;
  int v_min_local;
  float v_speed_local;
  int components_local;
  int *v_local;
  char *label_local;
  
  pIVar3 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((pIVar3->SkipItems & 1U) == 0) {
    label_local._7_1_ = false;
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components,0.0);
    for (local_50 = 0; local_50 < components; local_50 = local_50 + 1) {
      PushID(local_50);
      bVar2 = DragInt("##v",v + local_50,v_speed,v_min,v_max,display_format);
      label_local._7_1_ = label_local._7_1_ != false || bVar2;
      SameLine(0.0,(pIVar1->Style).ItemInnerSpacing.x);
      PopID();
      PopItemWidth();
    }
    PopID();
    text_end = FindRenderedTextEnd(label,(char *)0x0);
    TextUnformatted(label,text_end);
    EndGroup();
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::DragIntN(const char* label, int* v, int components, float v_speed, int v_min, int v_max, const char* display_format)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    bool value_changed = false;
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components);
    for (int i = 0; i < components; i++)
    {
        PushID(i);
        value_changed |= DragInt("##v", &v[i], v_speed, v_min, v_max, display_format);
        SameLine(0, g.Style.ItemInnerSpacing.x);
        PopID();
        PopItemWidth();
    }
    PopID();

    TextUnformatted(label, FindRenderedTextEnd(label));
    EndGroup();

    return value_changed;
}